

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::FindFileByName
          (EncodedDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  bool bVar1;
  EncodedDescriptorDatabase *this_00;
  pair<const_void_*,_int> encoded_file;
  
  this_00 = (EncodedDescriptorDatabase *)&this->index_;
  encoded_file = SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::FindFile
                           ((DescriptorIndex<std::pair<const_void_*,_int>_> *)this_00,filename);
  bVar1 = MaybeParse(this_00,encoded_file,output);
  return bVar1;
}

Assistant:

bool EncodedDescriptorDatabase::FindFileByName(const std::string& filename,
                                               FileDescriptorProto* output) {
  return MaybeParse(index_.FindFile(filename), output);
}